

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O3

void soul::SanityCheckPass::checkTypeSupportedForExternalEvents(Context *context,Type *t)

{
  size_t sVar1;
  Category CVar2;
  Structure *pSVar3;
  char (*in_R9) [36];
  Member *m;
  Member *t_00;
  long lVar4;
  Type TStack_68;
  CompileMessage local_50;
  
  CVar2 = t->category;
  if ((CVar2 & ~primitive) != wrap) {
    if (CVar2 == array) {
      Type::getArrayElementType(&TStack_68,t);
      checkTypeSupportedForExternalEvents(context,&TStack_68);
      RefCountedPtr<soul::Structure>::decIfNotNull(TStack_68.structure.object);
      CVar2 = t->category;
    }
    if (CVar2 == structure) {
      pSVar3 = Type::getStructRef(t);
      sVar1 = (pSVar3->members).numActive;
      if (sVar1 != 0) {
        t_00 = (pSVar3->members).items;
        lVar4 = sVar1 << 6;
        do {
          checkTypeSupportedForExternalEvents(context,&t_00->type);
          t_00 = t_00 + 1;
          lVar4 = lVar4 + -0x40;
        } while (lVar4 != 0);
      }
    }
    return;
  }
  CompileMessageHelpers::createMessage<char_const(&)[36]>
            (&local_50,(CompileMessageHelpers *)0x1,none,0x259aab,
             "Endpoints using wrap or clamp types",in_R9);
  AST::Context::throwError(context,&local_50,false);
}

Assistant:

static void checkTypeSupportedForExternalEvents (const AST::Context& context, const Type& t)
    {
        if (t.isBoundedInt())
            context.throwError (Errors::notYetImplemented ("Endpoints using wrap or clamp types"));

        if (t.isArray())
            checkTypeSupportedForExternalEvents (context, t.getArrayElementType());

        if (t.isStruct())
            for (auto& m : t.getStructRef().getMembers())
                checkTypeSupportedForExternalEvents (context, m.type);
    }